

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O3

bool flow::transform::foldConstantCondBr(IRHandler *handler)

{
  _List_node_base *p_Var1;
  BasicBlock *this;
  long *plVar2;
  BasicBlock *targetBlock;
  _func_int **pp_Var3;
  TerminateInstr *pTVar4;
  long lVar5;
  tuple<flow::Instr_*,_std::default_delete<flow::Instr>_> this_00;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> local_40;
  _func_int **local_38;
  
  p_Var1 = (handler->blocks_).
           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)&handler->blocks_) {
      return false;
    }
    this = (BasicBlock *)p_Var1[1]._M_next;
    pTVar4 = BasicBlock::getTerminator(this);
    if ((pTVar4 != (TerminateInstr *)0x0) &&
       (lVar5 = __dynamic_cast(pTVar4,&TerminateInstr::typeinfo,&CondBrInstr::typeinfo,0),
       lVar5 != 0)) {
      plVar2 = *(long **)(lVar5 + 0x50);
      lVar5 = *plVar2;
      if ((lVar5 != 0) &&
         (lVar5 = __dynamic_cast(lVar5,&Value::typeinfo,
                                 &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0), lVar5 != 0)
         ) {
        targetBlock = (BasicBlock *)plVar2[(ulong)(*(byte *)(lVar5 + 0x48) ^ 1) + 1];
        BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffc8,(char *)this);
        pp_Var3 = local_38;
        local_38 = (_func_int **)0x0;
        if (pp_Var3 != (_func_int **)0x0) {
          (**(code **)(*pp_Var3 + 8))();
        }
        this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)operator_new(0x68);
        BrInstr::BrInstr((BrInstr *)
                         this_00.
                         super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                         super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl,targetBlock);
        local_40._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
             (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
             (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
             this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
             super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
        BasicBlock::push_back
                  (this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_40);
        if ((_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)
            local_40._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
            super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != (Instr *)0x0) {
          (**(code **)(*(long *)local_40._M_t.
                                super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>
                                .super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl + 8))();
        }
        local_40._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
             (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
             (_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)0x0;
        if (local_38 != (_func_int **)0x0) {
          (**(code **)(*local_38 + 8))();
        }
        return true;
      }
    }
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

bool foldConstantCondBr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    if (auto condbr = dynamic_cast<CondBrInstr*>(bb->getTerminator())) {
      if (auto cond = dynamic_cast<ConstantBoolean*>(condbr->condition())) {
        // FLOW_TRACE("flow: rewrite condbr %{} with constant expression %{}", condbr->name(), cond->name());
        std::pair<BasicBlock*, BasicBlock*> use;

        if (cond->get()) {
          // FLOW_TRACE("if-condition is always true");
          use = std::make_pair(condbr->trueBlock(), condbr->falseBlock());
        } else {
          // FLOW_TRACE("if-condition is always false");
          use = std::make_pair(condbr->falseBlock(), condbr->trueBlock());
        }

        auto x = bb->remove(condbr);
        x.reset(nullptr);
        bb->push_back(std::make_unique<BrInstr>(use.first));
        return true;
      }
    }
  }

  return false;
}